

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int64_t fio_atol(char **pstr)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  ushort **ppuVar4;
  byte *pbVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  byte bVar9;
  char *pcVar10;
  bool bVar11;
  
  pcVar10 = *pstr;
  ppuVar4 = __ctype_b_loc();
  do {
    cVar2 = *pcVar10;
    pcVar10 = pcVar10 + 1;
  } while ((*(byte *)((long)*ppuVar4 + (long)cVar2 * 2 + 1) & 0x20) != 0);
  uVar6 = (ulong)(((int)cVar2 - 0x2bU & 0xfd) == 0);
  pbVar5 = (byte *)(pcVar10 + (uVar6 - 1));
  bVar3 = *pbVar5;
  pbVar7 = pbVar5;
  if (bVar3 < 0x58) {
    if (bVar3 != 0x30) {
      if (bVar3 == 0x42) {
LAB_00107ca0:
        do {
          pbVar1 = pbVar7 + 1;
          pbVar5 = pbVar7 + 1;
          pbVar7 = pbVar5;
        } while (*pbVar1 == 0x30);
        if ((*pbVar1 & 0xfe) == 0x30) {
          bVar3 = 0x31;
          uVar8 = 0;
          do {
            uVar8 = ((ulong)bVar3 + uVar8 * 2) - 0x30;
            bVar3 = pbVar5[1];
            pbVar5 = pbVar5 + 1;
          } while ((bVar3 & 0xfe) == 0x30);
        }
        else {
          uVar8 = 0;
        }
        goto LAB_00107e1a;
      }
      goto LAB_00107d7a;
    }
    pbVar7 = (byte *)(pcVar10 + uVar6);
    bVar3 = pcVar10[uVar6];
    if (bVar3 < 0x62) {
      if (bVar3 == 0x42) goto LAB_00107ca0;
      if (bVar3 != 0x58) goto LAB_00107d98;
LAB_00107ce0:
      bVar3 = pbVar7[1];
      pbVar5 = pbVar7;
      while (pbVar5 = pbVar5 + 1, bVar3 == 0x30) {
        bVar3 = pbVar5[1];
      }
      uVar8 = 0;
      do {
        bVar3 = *pbVar5;
        bVar9 = bVar3 - 0x30;
        if (9 < bVar9) {
          if ((byte)(bVar3 + 0xbf) < 6) {
            bVar9 = bVar3 - 0x37;
          }
          else {
            if (5 < (byte)(bVar3 + 0x9f)) {
              bVar11 = false;
              goto LAB_00107e03;
            }
            bVar9 = bVar3 + 0xa9;
          }
        }
        uVar6 = uVar8 << 4;
        uVar8 = bVar9 | uVar6;
        pbVar5 = pbVar5 + 1;
      } while (uVar6 < 0xffffffffffffff00);
      bVar3 = *pbVar5;
      bVar9 = bVar3 - 0x30;
      bVar11 = (byte)(bVar3 + 0xbf) < 6;
LAB_00107e03:
      if (bVar9 < 10) {
        return 0;
      }
      if (bVar11) {
        return 0;
      }
      if ((byte)(bVar3 + 0x9f) < 6) {
        return 0;
      }
      goto LAB_00107e1a;
    }
    if (bVar3 == 0x78) goto LAB_00107ce0;
    if (bVar3 == 0x62) goto LAB_00107ca0;
LAB_00107d98:
    do {
      bVar3 = pbVar5[1];
      pbVar5 = pbVar5 + 1;
    } while (bVar3 == 0x30);
    if ((byte)(bVar3 - 0x38) < 0xf8) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      do {
        uVar6 = (ulong)(bVar3 - 0x30) + uVar6 * 8;
        bVar3 = pbVar5[1];
        pbVar5 = pbVar5 + 1;
        if ((byte)(bVar3 - 0x38) < 0xf8) break;
      } while (uVar6 < 0xffffffffffffffc0);
    }
    if ((bVar3 & 0xf8) == 0x30) {
      return 0;
    }
  }
  else {
    if ((bVar3 == 0x58) || (bVar3 == 0x78)) goto LAB_00107ce0;
    if (bVar3 == 0x62) goto LAB_00107ca0;
LAB_00107d7a:
    if ((byte)(bVar3 - 0x3a) < 0xf6) {
      uVar8 = 0;
      goto LAB_00107e1a;
    }
    uVar6 = 0;
    do {
      uVar6 = (ulong)(bVar3 - 0x30) + uVar6 * 10;
      bVar3 = pbVar5[1];
      pbVar5 = pbVar5 + 1;
      if ((byte)(bVar3 - 0x3a) < 0xf6) break;
    } while (uVar6 < 0xffffffffffffff9c);
    if (0xf5 < (byte)(bVar3 - 0x3a)) {
      return 0;
    }
  }
  uVar8 = 0x7fffffffffffffff;
  if (-1 < (long)uVar6) {
    uVar8 = uVar6;
  }
LAB_00107e1a:
  uVar6 = -uVar8;
  if (cVar2 != '-') {
    uVar6 = uVar8;
  }
  *pstr = (char *)pbVar5;
  return uVar6;
}

Assistant:

int64_t fio_atol(char **pstr) {
  /* No binary representation in strtol */
  char *str = *pstr;
  uint64_t result = 0;
  uint8_t invert = 0;
  while (isspace(*str))
    ++(str);
  if (str[0] == '-') {
    invert ^= 1;
    ++str;
  } else if (*str == '+') {
    ++(str);
  }

  if (str[0] == 'B' || str[0] == 'b' ||
      (str[0] == '0' && (str[1] == 'b' || str[1] == 'B'))) {
    /* base 2 */
    if (str[0] == '0')
      str++;
    str++;
    fio_atol_skip_zero(&str);
    while (str[0] == '0' || str[0] == '1') {
      result = (result << 1) | (str[0] - '0');
      str++;
    }
    goto sign; /* no overlow protection, since sign might be embedded */

  } else if (str[0] == 'x' || str[0] == 'X' ||
             (str[0] == '0' && (str[1] == 'x' || str[1] == 'X'))) {
    /* base 16 */
    if (str[0] == '0')
      str++;
    str++;
    fio_atol_skip_zero(&str);
    result = fio_atol_consume_hex(&str);
    if (fio_atol_skip_hex_test(&str)) /* too large for a number */
      return 0;
    goto sign; /* no overlow protection, since sign might be embedded */
  } else if (str[0] == '0') {
    fio_atol_skip_zero(&str);
    /* base 8 */
    result = fio_atol_consume(&str, 8);
    if (fio_atol_skip_test(&str, 8)) /* too large for a number */
      return 0;
  } else {
    /* base 10 */
    result = fio_atol_consume(&str, 10);
    if (fio_atol_skip_test(&str, 10)) /* too large for a number */
      return 0;
  }
  if (result & ((uint64_t)1 << 63))
    result = INT64_MAX; /* signed overflow protection */
sign:
  if (invert)
    result = 0 - result;
  *pstr = str;
  return (int64_t)result;
}